

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

int Amap_ManCountInverters(Amap_Man_t *p)

{
  int iVar1;
  long *plVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Amap_Obj_t *pObj;
  Amap_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    plVar2 = (long *)Vec_PtrEntry(p->vObjs,local_1c);
    if (plVar2 != (long *)0x0) {
      local_20 = (uint)(0 < *(int *)((long)plVar2 +
                                    (long)(int)(uint)((*plVar2 < 0 ^ 0xffU) & 1) * 4 + 0x2c)) +
                 local_20;
    }
  }
  return local_20;
}

Assistant:

int Amap_ManCountInverters( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i, Counter = 0;
    Amap_ManForEachObj( p, pObj, i )
        Counter += (int)(pObj->nFouts[!pObj->fPolar] > 0);
    return Counter;
}